

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

MemberSyntax * __thiscall slang::parsing::Parser::parseGenerateBlock(Parser *this)

{
  SyntaxNode *pSVar1;
  NamedLabelSyntax *label;
  NamedBlockClauseSyntax *beginName;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Diagnostic *this_00;
  SourceLocation SVar5;
  undefined4 extraout_var;
  NamedBlockClauseSyntax *endBlock;
  GenerateBlockSyntax *pGVar6;
  MemberSyntax *pMVar7;
  EmptyMemberSyntax *pEVar8;
  BumpAllocator *dst;
  byte bVar9;
  bool bVar10;
  Token TVar11;
  SourceRange range;
  string_view arg;
  Token colon;
  Token begin;
  bool anyLocalModules;
  Token *local_108;
  NamedLabelSyntax *local_100;
  MemberSyntax *member;
  NamedBlockClauseSyntax *local_f0;
  Info *local_e8;
  undefined8 local_e0;
  Token *local_d8;
  Token end;
  TokenList local_c0;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  
  bVar2 = ParserBase::peek(&this->super_ParserBase,BeginKeyword);
  if (bVar2) {
    local_100 = (NamedLabelSyntax *)0x0;
  }
  else {
    bVar2 = ParserBase::peek(&this->super_ParserBase,Identifier);
    if (((!bVar2) || (TVar11 = ParserBase::peek(&this->super_ParserBase,1), TVar11.kind != Colon))
       || (TVar11 = ParserBase::peek(&this->super_ParserBase,2), TVar11.kind != BeginKeyword)) {
      pMVar7 = parseSingleMember(this,GenerateBlock);
      if (pMVar7 != (MemberSyntax *)0x0) {
        return pMVar7;
      }
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>._0_16_ =
           ParserBase::peek(&this->super_ParserBase);
      SVar5 = Token::location((Token *)&members);
      bVar2 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
      if (!bVar2) {
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x450005,SVar5);
      }
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len._0_4_ = 1;
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 0;
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[0] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[1] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[2] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[3] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[4] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[5] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[6] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[7] = '\0';
      members.stackBase[0x10] = '\0';
      members.stackBase[0x11] = '\0';
      members.stackBase[0x12] = '\0';
      members.stackBase[0x13] = '\0';
      members.stackBase[0x14] = '\0';
      members.stackBase[0x15] = '\0';
      members.stackBase[0x16] = '\0';
      members.stackBase[0x17] = '\0';
      members.stackBase[0] = '\0';
      members.stackBase[1] = '\0';
      members.stackBase[2] = '\0';
      members.stackBase[3] = '\0';
      members.stackBase[4] = '\0';
      members.stackBase[5] = '\0';
      members.stackBase[6] = '\0';
      members.stackBase[7] = '\0';
      members.stackBase[8] = '\0';
      members.stackBase[9] = '\0';
      members.stackBase[10] = '\0';
      members.stackBase[0xb] = '\0';
      members.stackBase[0xc] = '\0';
      members.stackBase[0xd] = '\0';
      members.stackBase[0xe] = '\0';
      members.stackBase[0xf] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
           (pointer)&PTR_getChild_00678c10;
      local_c0.super_SyntaxListBase.super_SyntaxNode.kind = 2;
      local_c0.super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent._M_extent_value =
           0;
      local_c0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_c0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_c0.super_SyntaxListBase.childCount = 0;
      local_c0.super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr = (pointer)0x0;
      local_c0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00679210;
      TVar11 = ParserBase::missingToken(&this->super_ParserBase,Semicolon,SVar5);
      pEVar8 = slang::syntax::SyntaxFactory::emptyMember
                         (&this->factory,
                          (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members,&local_c0,
                          TVar11);
      return &pEVar8->super_MemberSyntax;
    }
    TVar11 = ParserBase::consume(&this->super_ParserBase);
    colon = ParserBase::consume(&this->super_ParserBase);
    local_100 = slang::syntax::SyntaxFactory::namedLabel(&this->factory,TVar11,colon);
  }
  TVar11 = ParserBase::consume(&this->super_ParserBase);
  local_e8 = TVar11.info;
  local_e0 = TVar11._0_8_;
  local_f0 = parseNamedBlockClause(this);
  Token::Token(&end);
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
       (pointer)members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 8;
  anyLocalModules = false;
  local_108 = &(this->super_ParserBase).lastPoppedDelims.first;
  local_d8 = &(this->super_ParserBase).lastPoppedDelims.second;
  bVar2 = false;
  while( true ) {
    TVar11 = ParserBase::peek(&this->super_ParserBase);
    if ((TVar11.kind == EndOfFile) || ((TVar11._0_4_ & 0xffff) == 0x8e)) break;
    member = parseMember(this,GenerateBlock,&anyLocalModules);
    bVar10 = member == (MemberSyntax *)0x0;
    if (bVar10) {
      bVar3 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar11.kind);
      if (bVar3) {
        local_c0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        range = Token::range((Token *)&local_c0);
        this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
        local_c0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        arg = Token::valueText((Token *)&local_c0);
        Diagnostic::operator<<(this_00,arg);
        bVar9 = 0;
        if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
           (bVar9 = 0, (this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
          SVar5 = Token::location(local_108);
          Diagnostic::addNote(this_00,(DiagCode)0xc10005,SVar5);
          SVar5 = Token::location(local_d8);
          Diagnostic::addNote(this_00,(DiagCode)0xc00005,SVar5);
          bVar9 = 0;
        }
      }
      else {
        bVar9 = ~bVar2 & 1;
      }
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)bVar9 << 0x20 | 0x450005));
      bVar2 = bVar10;
    }
    else {
      checkMemberAllowed(this,&member->super_SyntaxNode,GenerateBlock);
      SmallVectorBase<slang::syntax::MemberSyntax*>::
      emplace_back<slang::syntax::MemberSyntax*const&>
                ((SmallVectorBase<slang::syntax::MemberSyntax*> *)&members,&member);
      pSVar1 = this->previewNode;
      this->previewNode = (SyntaxNode *)0x0;
      (member->super_SyntaxNode).previewNode = pSVar1;
      bVar2 = bVar10;
    }
  }
  if (anyLocalModules == true) {
    SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::pop_back(&(this->moduleDeclStack).
                super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              );
  }
  end = ParserBase::expect(&this->super_ParserBase,EndKeyword);
  dst = (this->super_ParserBase).alloc;
  iVar4 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                    (&members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>,
                     (EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)end.info);
  local_108 = (Token *)CONCAT44(extraout_var,iVar4);
  SmallVectorBase<slang::syntax::MemberSyntax_*>::cleanup
            (&members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>,(EVP_PKEY_CTX *)dst);
  endBlock = parseNamedBlockClause(this);
  beginName = local_f0;
  label = local_100;
  checkBlockNames(this,local_f0,endBlock,local_100);
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len._0_4_ = 1;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 0;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[0] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[1] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[2] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[3] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[4] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[5] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[6] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[7] = '\0';
  members.stackBase[0] = '\0';
  members.stackBase[1] = '\0';
  members.stackBase[2] = '\0';
  members.stackBase[3] = '\0';
  members.stackBase[4] = '\0';
  members.stackBase[5] = '\0';
  members.stackBase[6] = '\0';
  members.stackBase[7] = '\0';
  members.stackBase[8] = '\0';
  members.stackBase[9] = '\0';
  members.stackBase[10] = '\0';
  members.stackBase[0xb] = '\0';
  members.stackBase[0xc] = '\0';
  members.stackBase[0xd] = '\0';
  members.stackBase[0xe] = '\0';
  members.stackBase[0xf] = '\0';
  members.stackBase[0x10] = '\0';
  members.stackBase[0x11] = '\0';
  members.stackBase[0x12] = '\0';
  members.stackBase[0x13] = '\0';
  members.stackBase[0x14] = '\0';
  members.stackBase[0x15] = '\0';
  members.stackBase[0x16] = '\0';
  members.stackBase[0x17] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
       (pointer)&PTR_getChild_00678c10;
  local_c0.super_SyntaxListBase.super_SyntaxNode.kind = 1;
  local_c0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_c0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_c0.super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr = local_108;
  local_c0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00678d00;
  begin.info = local_e8;
  begin.kind = (undefined2)local_e0;
  begin._2_1_ = local_e0._2_1_;
  begin.numFlags.raw = local_e0._3_1_;
  begin.rawLen = local_e0._4_4_;
  pGVar6 = slang::syntax::SyntaxFactory::generateBlock
                     (&this->factory,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members,
                      label,begin,beginName,(SyntaxList<slang::syntax::MemberSyntax> *)&local_c0,end
                      ,endBlock);
  return &pGVar6->super_MemberSyntax;
}

Assistant:

MemberSyntax& Parser::parseGenerateBlock() {
    NamedLabelSyntax* label = nullptr;
    if (!peek(TokenKind::BeginKeyword)) {
        if (!peek(TokenKind::Identifier) || peek(1).kind != TokenKind::Colon ||
            peek(2).kind != TokenKind::BeginKeyword) {
            // This is just a single member instead of a block.
            auto member = parseSingleMember(SyntaxKind::GenerateBlock);
            if (member)
                return *member;

            // If there was some syntax error that caused parseMember to return null, fabricate an
            // empty member here and let our caller sort it out.
            auto loc = peek().location();
            if (!haveDiagAtCurrentLoc())
                addDiag(diag::ExpectedMember, loc);
            return factory.emptyMember(nullptr, nullptr, missingToken(TokenKind::Semicolon, loc));
        }

        auto name = consume();
        label = &factory.namedLabel(name, consume());
    }

    auto begin = consume();
    auto beginName = parseNamedBlockClause();

    Token end;
    auto members =
        parseMemberList<MemberSyntax>(TokenKind::EndKeyword, end, SyntaxKind::GenerateBlock,
                                      [this](SyntaxKind parentKind, bool& anyLocalModules) {
                                          return parseMember(parentKind, anyLocalModules);
                                      });

    auto endName = parseNamedBlockClause();
    checkBlockNames(beginName, endName, label);

    return factory.generateBlock(nullptr, // never any attributes
                                 label, begin, beginName, members, end, endName);
}